

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.cpp
# Opt level: O0

void __thiscall
StickyAssign_FirstAssignmentAfterInitialization_Test::TestBody
          (StickyAssign_FirstAssignmentAfterInitialization_Test *this)

{
  bool bVar1;
  int *rhs;
  char *message;
  AssertHelper local_58;
  Message local_50 [3];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  sticky_assign<int> local_18;
  sticky_assign<int> v;
  StickyAssign_FirstAssignmentAfterInitialization_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x11;
  v = (sticky_assign<int>)this;
  pstore::serialize::sticky_assign<int>::sticky_assign<int>
            (&local_18,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x49;
  pstore::serialize::sticky_assign<int>::operator=(&local_18,(int *)&gtest_ar.message_);
  local_34 = 0x11;
  rhs = pstore::serialize::sticky_assign<int>::get(&local_18);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"17","v.get ()",&local_34,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_common.cpp"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST (StickyAssign, FirstAssignmentAfterInitialization) {
    pstore::serialize::sticky_assign<int> v (17);
    v = 73;
    EXPECT_EQ (17, v.get ());
}